

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O1

BOOL DBG_init_channels(void)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 *puVar8;
  uint uVar9;
  char **ppcVar10;
  DWORD *pDVar11;
  char *__s;
  bool bVar12;
  char *local_38;
  
  InternalInitializeCriticalSection(&fprintf_crit_section);
  lVar5 = 0;
  do {
    dbg_channel_flags[lVar5] = 0x10;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x17);
  pcVar6 = MiscGetenv("PAL_DBG_CHANNELS");
  uVar9 = 0;
  if (pcVar6 == (char *)0x0) {
    local_38 = (char *)0x0;
    pcVar6 = local_38;
LAB_00132a6f:
    do {
      if (local_38 == (char *)0x0) goto LAB_00132c16;
      do {
        __s = local_38 + 1;
        cVar1 = *local_38;
        if (cVar1 == '\0') goto LAB_00132c16;
      } while ((cVar1 != '+') && (local_38 = __s, cVar1 != '-'));
      pcVar7 = strchr(__s,0x3a);
      if (pcVar7 == (char *)0x0) {
        local_38 = (char *)0x0;
      }
      else {
        local_38 = pcVar7 + 1;
        *pcVar7 = '\0';
      }
      pcVar7 = strchr(__s,0x2e);
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
        iVar2 = strcmp(pcVar7 + 1,"all");
        if (iVar2 == 0) {
          uVar9 = 0;
          if (cVar1 == '+') {
            uVar9 = 0xffff;
          }
        }
        else {
          ppcVar10 = dbg_level_names;
          lVar5 = 0;
          do {
            iVar2 = strcmp(pcVar7 + 1,*ppcVar10);
            if (iVar2 == 0) {
              uVar9 = -(uint)(cVar1 != '+') ^ 1 << ((byte)-(char)lVar5 & 0x1f);
              bVar12 = lVar5 == -6;
              goto LAB_00132b64;
            }
            lVar5 = lVar5 + -1;
            ppcVar10 = ppcVar10 + 1;
          } while (lVar5 != -6);
          bVar12 = true;
LAB_00132b64:
          if (bVar12) goto LAB_00132a6f;
        }
        uVar3 = uVar9 | 0x20;
        uVar4 = uVar9 & 1;
        uVar9 = uVar9 & 0xffffffde;
        if (uVar4 != 0) {
          uVar9 = uVar3;
        }
        iVar2 = strcmp(__s,"all");
        if (iVar2 == 0) {
          lVar5 = 0;
          if (cVar1 == '+') {
            do {
              dbg_channel_flags[lVar5] = dbg_channel_flags[lVar5] | uVar9;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x17);
          }
          else {
            do {
              dbg_channel_flags[lVar5] = dbg_channel_flags[lVar5] & uVar9;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x17);
          }
        }
        else {
          lVar5 = 0;
          pDVar11 = dbg_channel_flags;
          do {
            iVar2 = strcmp(__s,*(char **)((long)dbg_channel_names + lVar5));
            if (iVar2 == 0) {
              uVar4 = *pDVar11 & uVar9;
              if (cVar1 == '+') {
                uVar4 = *pDVar11 | uVar9;
              }
              *pDVar11 = uVar4;
              break;
            }
            pDVar11 = pDVar11 + 1;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0xb8);
        }
      }
    } while( true );
  }
  local_38 = PAL__strdup(pcVar6);
  pcVar6 = local_38;
  if (local_38 != (char *)0x0) goto LAB_00132a6f;
  goto LAB_00132d57;
LAB_00132c16:
  PAL_free(pcVar6);
  pcVar6 = MiscGetenv("PAL_API_TRACING");
  if (((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) ||
     (iVar2 = strcmp(pcVar6,"stderr"), iVar2 == 0)) {
    puVar8 = (undefined8 *)&stderr;
LAB_00132ca7:
    output_file = (FILE *)*puVar8;
  }
  else {
    iVar2 = strcmp(pcVar6,"stdout");
    if (iVar2 == 0) {
      puVar8 = (undefined8 *)&stdout;
      goto LAB_00132ca7;
    }
    output_file = (FILE *)fopen64(pcVar6,"at");
    if ((FILE *)output_file == (FILE *)0x0) {
      output_file = (FILE *)_stderr;
      fprintf(_stderr,
              "Can\'t open %s for writing : debug messages will go to stderr. Check your PAL_API_TRACING variable!\n"
              ,pcVar6);
    }
  }
  pcVar6 = MiscGetenv("PAL_DISABLE_ASSERTS");
  if ((pcVar6 == (char *)0x0) || (iVar2 = strcmp(pcVar6,"1"), iVar2 != 0)) {
    g_Dbg_asserts_enabled = 1;
  }
  else {
    g_Dbg_asserts_enabled = 0;
  }
  pcVar6 = MiscGetenv("PAL_API_LEVELS");
  iVar2 = 1;
  if (pcVar6 != (char *)0x0) {
    iVar2 = atoi(pcVar6);
  }
  if (iVar2 == 0) {
    max_entry_level = iVar2;
    return 1;
  }
  max_entry_level = iVar2;
  uVar9 = pthread_key_create(&entry_level_key,(__destr_function *)0x0);
  __stream = _stderr;
  if (uVar9 == 0) {
    return 1;
  }
  pcVar6 = strerror(uVar9);
  fprintf(__stream,"ERROR : pthread_key_create() failed error:%d (%s)\n",(ulong)uVar9,pcVar6);
LAB_00132d57:
  DeleteCriticalSection(&fprintf_crit_section);
  return 0;
}

Assistant:

BOOL DBG_init_channels(void)
{
    INT i;
    LPCSTR env_string;
    LPSTR env_workstring;
    LPSTR env_pcache;
    LPSTR entry_ptr;
    LPSTR level_ptr;
    CHAR plus_or_minus;
    DWORD flag_mask = 0;
    int ret;

    InternalInitializeCriticalSection(&fprintf_crit_section);

    /* output only asserts by default [only affects no-vararg-support case; if
       we have varargs, these flags aren't even checked for ASSERTs] */
    for(i=0;i<DCI_LAST;i++)
        dbg_channel_flags[i]=1<<DLI_ASSERT;

    /* parse PAL_DBG_CHANNELS environment variable */

    if (!(env_string = MiscGetenv(ENV_CHANNELS)))
    {
        env_pcache = env_workstring = NULL;
    }
    else
    {
        env_pcache = env_workstring = PAL__strdup(env_string);

        if (env_workstring == NULL)
        {
            /* Not enough memory */
            DeleteCriticalSection(&fprintf_crit_section);
            return FALSE;
        }
    }
    while(env_workstring)
    {
        entry_ptr=env_workstring;

        /* find beginning of next entry */
        while((*entry_ptr != '\0') &&(*entry_ptr != '+') && (*entry_ptr != '-'))
        {
            entry_ptr++;
        }

        /* break if end of string is reached */
        if(*entry_ptr == '\0')
        {
           break;
        }

        plus_or_minus=*entry_ptr++;

        /* find end of entry; if strchr returns NULL, we have reached the end
           of the string and we will leave the loop at the end of this pass. */
        env_workstring=strchr(entry_ptr,':');

        /* NULL-terminate entry, make env_string point to rest of string */
        if(env_workstring)
        {
            *env_workstring++='\0';
        }

        /* find period that separates channel name from level name */
        level_ptr=strchr(entry_ptr,'.');

        /* an entry with no period is illegal : ignore it */
        if(!level_ptr)
        {
            continue;
        }
        /* NULL-terminate channel name, make level_ptr point to the level name */
        *level_ptr++='\0';

        /* build the flag mask based on requested level */

        /* if "all" level is specified, we want to open/close all levels at
           once, so mask is either all ones or all zeroes */
        if(!strcmp(level_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                flag_mask=0xFFFF;  /* OR this to open all levels */
            }
            else
            {
                flag_mask=0;       /* AND this to close all levels*/
            }
        }
        else
        {
            for(i=0;i<DLI_LAST;i++)
            {
                if(!strcmp(level_ptr,dbg_level_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        flag_mask=1<<i;     /* OR this to open the level */
                    }
                    else
                    {
                        flag_mask=~(1<<i);  /* AND this to close the level */
                    }
                    break;
                }
            }
            /* didn't find a matching level : skip it. */
            if(i==DLI_LAST)
            {
                continue;
            }
        }

        /* Set EXIT and ENTRY channels to be identical */
        if(!(flag_mask & (1<<DLI_ENTRY)))
        {
            flag_mask = flag_mask & (~(1<<DLI_EXIT));
        }
        else
        {
            flag_mask = flag_mask | (1<<DLI_EXIT);
        }

        /* apply the flag mask to the specified channel */

        /* if "all" channel is specified, apply mask to all channels */
        if(!strcmp(entry_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] |= flag_mask; /* OR to open levels*/
                }
            }
            else
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] &= flag_mask; /* AND to close levels */
                }
            }
        }
        else
        {
            for(i=0;i<DCI_LAST;i++)
            {
                if(!strcmp(entry_ptr,dbg_channel_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        dbg_channel_flags[i] |= flag_mask;
                    }
                    else
                    {
                        dbg_channel_flags[i] &= flag_mask;
                    }

                    break;
                }
            }
            /* ignore the entry if the channel name is unknown */
        }
        /* done processing this entry; on to the next. */
    }
    PAL_free(env_pcache);

    /* select output file */
    env_string=MiscGetenv(ENV_FILE);
    if(env_string && *env_string!='\0')
    {
        if(!strcmp(env_string, "stderr"))
        {
            output_file = stderr;
        }
        else if(!strcmp(env_string, "stdout"))
        {
            output_file = stdout;
        }
        else
        {
            output_file = fopen(env_string,FOPEN_FLAGS);

            /* if file can't be opened, default to stderr */
            if(!output_file)
            {
                output_file = stderr;
                fprintf(stderr, "Can't open %s for writing : debug messages "
                        "will go to stderr. Check your PAL_API_TRACING "
                        "variable!\n", env_string);
            }
        }
    }
    else
    {
        output_file = stderr; /* output to stderr by default */
    }

    /* see if we need to disable assertions */
    env_string = MiscGetenv(ENV_ASSERTS);
    if(env_string && 0 == strcmp(env_string,"1"))
    {
        g_Dbg_asserts_enabled = FALSE;
    }
    else
    {
        g_Dbg_asserts_enabled = TRUE;
    }

    /* select ENTRY level limitation */
    env_string = MiscGetenv(ENV_ENTRY_LEVELS);
    if(env_string)
    {
        max_entry_level = atoi(env_string);
    }
    else
    {
        max_entry_level = 1;
    }

    /* if necessary, allocate TLS key for entry nesting level */
    if(0 != max_entry_level)
    {
        if ((ret = pthread_key_create(&entry_level_key,NULL)) != 0)
        {
            fprintf(stderr, "ERROR : pthread_key_create() failed error:%d (%s)\n",
                   ret, strerror(ret));
            DeleteCriticalSection(&fprintf_crit_section);;
            return FALSE;
        }
    }

    return TRUE;
}